

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

BOOL check_opcode_types(compiler_common *common,PCRE2_SPTR16 cc,PCRE2_SPTR16 ccend)

{
  PCRE2_SPTR16 pPVar1;
  uint local_4c;
  PCRE2_SPTR16 local_40;
  PCRE2_SPTR16 assert_back_end;
  PCRE2_SPTR16 slot;
  int count;
  PCRE2_SPTR16 ccend_local;
  PCRE2_SPTR16 cc_local;
  compiler_common *common_local;
  
  local_40 = cc + -1;
  ccend_local = cc;
  do {
    if (ccend <= ccend_local) {
      return 1;
    }
    switch(*ccend_local) {
    case 3:
      common->has_set_som = 1;
      common->might_be_empty = 1;
      ccend_local = ccend_local + 1;
      break;
    default:
      ccend_local = next_opcode(common,ccend_local);
      if (ccend_local == (PCRE2_SPTR16)0x0) {
        return 0;
      }
      break;
    case 0x71:
    case 0x72:
      common->optimized_cbracket[ccend_local[1]] = '\0';
      ccend_local = ccend_local + 2;
      break;
    case 0x73:
    case 0x74:
    case 0x8e:
      assert_back_end = common->name_table + (ulong)ccend_local[1] * common->name_entry_size;
      slot._4_4_ = (uint)ccend_local[2];
      while (0 < (int)slot._4_4_) {
        common->optimized_cbracket[*assert_back_end] = '\0';
        assert_back_end = assert_back_end + common->name_entry_size;
        slot._4_4_ = slot._4_4_ - 1;
      }
      ccend_local = ccend_local + 3;
      break;
    case 0x75:
      if (common->recursive_head_ptr == 0) {
        common->recursive_head_ptr = common->ovector_start;
        common->ovector_start = common->ovector_start + 8;
      }
      ccend_local = ccend_local + 2;
      break;
    case 0x76:
    case 0x77:
      if (common->capture_last_ptr == 0) {
        common->capture_last_ptr = common->ovector_start;
        common->ovector_start = common->ovector_start + 8;
      }
      if (*ccend_local == 0x76) {
        local_4c = 4;
      }
      else {
        local_4c = (uint)ccend_local[3];
      }
      ccend_local = ccend_local + (int)local_4c;
      break;
    case 0x80:
      pPVar1 = bracketend(ccend_local);
      if (local_40 < pPVar1) {
        local_40 = pPVar1;
      }
      ccend_local = ccend_local + 2;
      break;
    case 0x86:
    case 0x8b:
      common->optimized_cbracket[ccend_local[2]] = '\0';
      ccend_local = ccend_local + 3;
      break;
    case 0x87:
    case 0x8c:
      if ((ccend_local[2] == 0x76) || (ccend_local[2] == 0x77)) {
        return 0;
      }
      ccend_local = ccend_local + 2;
      break;
    case 0x8d:
      common->optimized_cbracket[ccend_local[1]] = '\0';
      ccend_local = ccend_local + 2;
      break;
    case 0x99:
      if (ccend_local < local_40) {
        common->has_skip_in_assert_back = 1;
      }
      ccend_local = ccend_local + 1;
      break;
    case 0x9a:
      common->control_head_ptr = 1;
      common->has_skip_arg = 1;
      if (ccend_local < local_40) {
        common->has_skip_in_assert_back = 1;
      }
      ccend_local = ccend_local + (int)(ccend_local[1] + 3);
      break;
    case 0x9b:
      common->has_then = 1;
      common->control_head_ptr = 1;
      ccend_local = ccend_local + 1;
      break;
    case 0x9c:
      common->has_then = 1;
      common->control_head_ptr = 1;
    case 0x96:
    case 0x98:
    case 0x9e:
      if (common->mark_ptr == 0) {
        common->mark_ptr = common->ovector_start;
        common->ovector_start = common->ovector_start + 8;
      }
      ccend_local = ccend_local + (int)(ccend_local[1] + 3);
    }
  } while( true );
}

Assistant:

static BOOL check_opcode_types(compiler_common *common, PCRE2_SPTR cc, PCRE2_SPTR ccend)
{
int count;
PCRE2_SPTR slot;
PCRE2_SPTR assert_back_end = cc - 1;

/* Calculate important variables (like stack size) and checks whether all opcodes are supported. */
while (cc < ccend)
  {
  switch(*cc)
    {
    case OP_SET_SOM:
    common->has_set_som = TRUE;
    common->might_be_empty = TRUE;
    cc += 1;
    break;

    case OP_REF:
    case OP_REFI:
    common->optimized_cbracket[GET2(cc, 1)] = 0;
    cc += 1 + IMM2_SIZE;
    break;

    case OP_CBRAPOS:
    case OP_SCBRAPOS:
    common->optimized_cbracket[GET2(cc, 1 + LINK_SIZE)] = 0;
    cc += 1 + LINK_SIZE + IMM2_SIZE;
    break;

    case OP_COND:
    case OP_SCOND:
    /* Only AUTO_CALLOUT can insert this opcode. We do
       not intend to support this case. */
    if (cc[1 + LINK_SIZE] == OP_CALLOUT || cc[1 + LINK_SIZE] == OP_CALLOUT_STR)
      return FALSE;
    cc += 1 + LINK_SIZE;
    break;

    case OP_CREF:
    common->optimized_cbracket[GET2(cc, 1)] = 0;
    cc += 1 + IMM2_SIZE;
    break;

    case OP_DNREF:
    case OP_DNREFI:
    case OP_DNCREF:
    count = GET2(cc, 1 + IMM2_SIZE);
    slot = common->name_table + GET2(cc, 1) * common->name_entry_size;
    while (count-- > 0)
      {
      common->optimized_cbracket[GET2(slot, 0)] = 0;
      slot += common->name_entry_size;
      }
    cc += 1 + 2 * IMM2_SIZE;
    break;

    case OP_RECURSE:
    /* Set its value only once. */
    if (common->recursive_head_ptr == 0)
      {
      common->recursive_head_ptr = common->ovector_start;
      common->ovector_start += sizeof(sljit_sw);
      }
    cc += 1 + LINK_SIZE;
    break;

    case OP_CALLOUT:
    case OP_CALLOUT_STR:
    if (common->capture_last_ptr == 0)
      {
      common->capture_last_ptr = common->ovector_start;
      common->ovector_start += sizeof(sljit_sw);
      }
    cc += (*cc == OP_CALLOUT) ? PRIV(OP_lengths)[OP_CALLOUT] : GET(cc, 1 + 2*LINK_SIZE);
    break;

    case OP_ASSERTBACK:
    slot = bracketend(cc);
    if (slot > assert_back_end)
      assert_back_end = slot;
    cc += 1 + LINK_SIZE;
    break;

    case OP_THEN_ARG:
    common->has_then = TRUE;
    common->control_head_ptr = 1;
    /* Fall through. */

    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_MARK:
    if (common->mark_ptr == 0)
      {
      common->mark_ptr = common->ovector_start;
      common->ovector_start += sizeof(sljit_sw);
      }
    cc += 1 + 2 + cc[1];
    break;

    case OP_THEN:
    common->has_then = TRUE;
    common->control_head_ptr = 1;
    cc += 1;
    break;

    case OP_SKIP:
    if (cc < assert_back_end)
      common->has_skip_in_assert_back = TRUE;
    cc += 1;
    break;

    case OP_SKIP_ARG:
    common->control_head_ptr = 1;
    common->has_skip_arg = TRUE;
    if (cc < assert_back_end)
      common->has_skip_in_assert_back = TRUE;
    cc += 1 + 2 + cc[1];
    break;

    default:
    cc = next_opcode(common, cc);
    if (cc == NULL)
      return FALSE;
    break;
    }
  }
return TRUE;
}